

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void auto_arima_setStationarityParameters(auto_arima_object obj,char *test,double alpha,char *type)

{
  int iVar1;
  char *__s;
  
  iVar1 = strcmp(test,"kpss");
  if (iVar1 != 0) {
    iVar1 = strcmp(test,"pp");
    if (iVar1 != 0) {
      iVar1 = strcmp(test,"df");
      if (iVar1 != 0) {
        iVar1 = strcmp(test,"adf");
        if (iVar1 != 0) {
          __s = "Only three tests are allowed - kpss, df and pp ";
          goto LAB_0010db0b;
        }
      }
    }
  }
  strcpy(obj->test,test);
  iVar1 = strcmp(type,"level");
  if (iVar1 != 0) {
    iVar1 = strcmp(type,"trend");
    if (iVar1 != 0) {
      __s = "Only two tests are allowed - level and trend ";
LAB_0010db0b:
      puts(__s);
      exit(-1);
    }
  }
  strcpy(obj->type,type);
  obj->alpha_test = alpha;
  return;
}

Assistant:

void auto_arima_setStationarityParameters(auto_arima_object obj,const char *test, double alpha, const char *type) {
	if (!strcmp(test,"kpss") || !strcmp(test,"pp") || !strcmp(test,"df") || !strcmp(test,"adf")) {
		strcpy(obj->test,test);
	} else {
		printf("Only three tests are allowed - kpss, df and pp \n");
		exit(-1);
	}

	if (!strcmp(type,"level") || !strcmp(type,"trend")) {
		strcpy(obj->type,type);
	} else {
		printf("Only two tests are allowed - level and trend \n");
		exit(-1);
	}

	obj->alpha_test = alpha;
}